

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O2

void __thiscall
agge::tests::LayoutTests::NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsNotFound
          (LayoutTests *this)

{
  wrap limiter;
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  end;
  long lVar1;
  allocator local_3d9;
  factory_ptr f;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_3c8;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_3b8;
  int local_3a8 [16];
  _Vector_base<agge::text_line,_std::allocator<agge::text_line>_> local_368;
  _Vector_base<int,_std::allocator<int>_> local_350;
  _Vector_base<int,_std::allocator<int>_> local_338;
  _Vector_base<int,_std::allocator<int>_> local_320;
  _Vector_base<int,_std::allocator<int>_> local_308;
  _Vector_base<int,_std::allocator<int>_> local_2f0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_2d8;
  _Vector_base<int,_std::allocator<int>_> local_2c0;
  _Vector_base<int,_std::allocator<int>_> local_2a8;
  _Vector_base<int,_std::allocator<int>_> local_290;
  _Vector_base<int,_std::allocator<int>_> local_278;
  _Vector_base<int,_std::allocator<int>_> local_260;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_248;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_230;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_218;
  ref_glyph_run local_200;
  string local_1c8;
  ref_text_line local_1a8;
  LocationInfo local_180;
  ref_text_line local_158;
  richtext_t local_130;
  layout l;
  char_to_index indices [2];
  _Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> local_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  end._M_current = (text_line *)indices;
  indices[0].symbol = 0x41;
  indices[0].index = 1;
  indices[1].symbol = 0x20;
  indices[1].index = 0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x4010000000000000;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0x4014000000000000;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  create_single_font_factory<2ul,2ul>
            ((LayoutTests *)&f,(font_metrics *)this,
             (char_to_index (*) [2])(anonymous_namespace)::c_fm1,(glyph (*) [2])end._M_current);
  layout::layout(&l);
  std::__cxx11::string::string((string *)&local_200,"AAAAA   A   A",(allocator *)&local_1a8);
  R(&local_130,(string *)&local_200);
  local_3a8[10] = 0x41d00000;
  local_3a8[0xb] = 0;
  local_3a8[0xc] = 0;
  local_3a8[0xd] = 0;
  local_3a8[0xe] = 0;
  local_3a8[0xf] = local_3a8[0xf] & 0xffffff00;
  lVar1 = (ulong)(uint)local_3a8[0xf] << 0x20;
  limiter._sow.next = (int)lVar1;
  limiter._previous_space = (bool)(char)((ulong)lVar1 >> 0x20);
  limiter._21_3_ = (int3)((ulong)lVar1 >> 0x28);
  limiter._limit = 26.0;
  limiter._eow.extent = 0.0;
  limiter._eow.next = 0;
  limiter._sow.extent = 0.0;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            (&l,&local_130,limiter,
             f.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_130);
  std::__cxx11::string::~string((string *)&local_200);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3b8,
             &((f.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_3a8[9] = 1;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_2c0,(plural_ *)&plural,
                     local_3a8 + 9);
  local_3a8[8] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2a8,
                   (vector<int,_std::allocator<int>_> *)&local_2c0,local_3a8 + 8);
  local_3a8[7] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_290,
                   (vector<int,_std::allocator<int>_> *)&local_2a8,local_3a8 + 7);
  local_3a8[6] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_278,
                   (vector<int,_std::allocator<int>_> *)&local_290,local_3a8 + 6);
  local_3a8[5] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_260,
                   (vector<int,_std::allocator<int>_> *)&local_278,local_3a8 + 5);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)&local_130,(shared_ptr<agge::font> *)&local_3b8,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_260);
  plural_::operator+(&local_248,(plural_ *)&plural,(ref_glyph_run *)&local_130);
  ref_text_line::ref_text_line(&local_1a8,0.0,10.0,0.0,&local_248);
  plural_::operator+(&local_230,(plural_ *)&plural,&local_1a8);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3c8,
             &((f.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_3a8[4] = 1;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_350,(plural_ *)&plural,
                     local_3a8 + 4);
  local_3a8[3] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_338,
                   (vector<int,_std::allocator<int>_> *)&local_350,local_3a8 + 3);
  local_3a8[2] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_320,
                   (vector<int,_std::allocator<int>_> *)&local_338,local_3a8 + 2);
  local_3a8[1] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_308,
                   (vector<int,_std::allocator<int>_> *)&local_320,local_3a8 + 1);
  local_3a8[0] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2f0,
                   (vector<int,_std::allocator<int>_> *)&local_308,local_3a8);
  ref_glyph_run::ref_glyph_run<int>
            (&local_200,(shared_ptr<agge::font> *)&local_3c8,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_2f0);
  plural_::operator+(&local_2d8,(plural_ *)&plural,&local_200);
  ref_text_line::ref_text_line(&local_158,0.0,24.0,0.0,&local_2d8);
  tests::operator+(&local_218,&local_230,&local_158);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_368,
             (tests *)l._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )l._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
               _M_impl.super__Vector_impl_data._M_finish,end);
  std::__cxx11::string::string
            ((string *)&local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_3d9);
  ut::LocationInfo::LocationInfo(&local_180,&local_1c8,0x216);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_218,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_368,
             &local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_368);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_218);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_158._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_2d8);
  ref_glyph_run::~ref_glyph_run(&local_200);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_308);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_320);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_338);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_350);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3c8._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_230);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_1a8._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_248);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)&local_130);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_260);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_278);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_290);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b8._M_refcount);
  layout::~layout(&l);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  lVar1 = 0x38;
  do {
    std::_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::
    ~_Vector_base((_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *
                  )((long)&local_68._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

test( NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsNotFound )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 1 }, { L' ', 0 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 4, 0 } },
					{ { 5, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout l;

				// ACT
				l.process(R("AAAAA   A   A"), limit::wrap(26.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 1 + 1 + 1 + 1))
					+ ref_text_line(0.0f, 24.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 0 + 0 + 0 + 1)),
					mkvector(l.begin(), l.end()));
			}